

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools_common.c
# Opt level: O0

int read_yuv_frame(AvxInputContext *input_ctx,aom_image_t *yuv_frame)

{
  FILE *__stream;
  int iVar1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  int iVar5;
  aom_image_t *in_RSI;
  long in_RDI;
  size_t more;
  size_t left;
  size_t buf_position;
  size_t needed;
  int r;
  int h;
  int w;
  uint8_t *ptr;
  int bytespp;
  int shortread;
  int plane;
  FileTypeDetectionBuffer *detect;
  FILE *f;
  size_t local_78;
  size_t local_58;
  size_t local_50;
  int local_44;
  int local_3c;
  uchar *local_38;
  uint local_28;
  int local_24;
  
  __stream = *(FILE **)(in_RDI + 8);
  local_28 = 0;
  iVar1 = 1;
  if ((in_RSI->fmt & 0x800) != AOM_IMG_FMT_NONE) {
    iVar1 = 2;
  }
  local_24 = 0;
  while( true ) {
    if (2 < local_24) {
      return local_28;
    }
    local_3c = aom_img_plane_width(in_RSI,local_24);
    iVar2 = aom_img_plane_height(in_RSI,local_24);
    if ((in_RSI->fmt == AOM_IMG_FMT_NV12) && (1 < local_24)) break;
    if ((in_RSI->fmt == AOM_IMG_FMT_NV12) && (local_24 == 1)) {
      local_3c = local_3c << 1;
    }
    if (local_24 == 1) {
      iVar5 = 1;
      if (in_RSI->fmt == AOM_IMG_FMT_YV12) {
        iVar5 = 2;
      }
      local_38 = in_RSI->planes[iVar5];
    }
    else if (local_24 == 2) {
      iVar5 = 2;
      if (in_RSI->fmt == AOM_IMG_FMT_YV12) {
        iVar5 = 1;
      }
      local_38 = in_RSI->planes[iVar5];
    }
    else {
      local_38 = in_RSI->planes[local_24];
    }
    for (local_44 = 0; local_44 < iVar2; local_44 = local_44 + 1) {
      local_50 = (size_t)(local_3c * iVar1);
      local_58 = 0;
      uVar3 = *(long *)(in_RDI + 0x40) - *(long *)(in_RDI + 0x48);
      if (uVar3 != 0) {
        local_78 = local_50;
        if (uVar3 < local_50) {
          local_78 = uVar3;
        }
        memcpy(local_38,(void *)(in_RDI + 0x18 + *(long *)(in_RDI + 0x48)),local_78);
        local_58 = local_78;
        local_50 = local_50 - local_78;
        *(size_t *)(in_RDI + 0x48) = local_78 + *(long *)(in_RDI + 0x48);
      }
      if (local_50 != 0) {
        sVar4 = fread(local_38 + local_58,1,local_50,__stream);
        local_28 = sVar4 < local_50 | local_28;
      }
      local_38 = local_38 + in_RSI->stride[local_24];
    }
    local_24 = local_24 + 1;
  }
  return local_28;
}

Assistant:

int read_yuv_frame(struct AvxInputContext *input_ctx, aom_image_t *yuv_frame) {
  FILE *f = input_ctx->file;
  struct FileTypeDetectionBuffer *detect = &input_ctx->detect;
  int plane = 0;
  int shortread = 0;
  const int bytespp = (yuv_frame->fmt & AOM_IMG_FMT_HIGHBITDEPTH) ? 2 : 1;

  for (plane = 0; plane < 3; ++plane) {
    uint8_t *ptr;
    int w = aom_img_plane_width(yuv_frame, plane);
    const int h = aom_img_plane_height(yuv_frame, plane);
    int r;
    // Assuming that for nv12 we read all chroma data at once
    if (yuv_frame->fmt == AOM_IMG_FMT_NV12 && plane > 1) break;
    if (yuv_frame->fmt == AOM_IMG_FMT_NV12 && plane == 1) w *= 2;
    /* Determine the correct plane based on the image format. The for-loop
     * always counts in Y,U,V order, but this may not match the order of
     * the data on disk.
     */
    switch (plane) {
      case 1:
        ptr =
            yuv_frame->planes[yuv_frame->fmt == AOM_IMG_FMT_YV12 ? AOM_PLANE_V
                                                                 : AOM_PLANE_U];
        break;
      case 2:
        ptr =
            yuv_frame->planes[yuv_frame->fmt == AOM_IMG_FMT_YV12 ? AOM_PLANE_U
                                                                 : AOM_PLANE_V];
        break;
      default: ptr = yuv_frame->planes[plane];
    }

    for (r = 0; r < h; ++r) {
      size_t needed = w * bytespp;
      size_t buf_position = 0;
      const size_t left = detect->buf_read - detect->position;
      if (left > 0) {
        const size_t more = (left < needed) ? left : needed;
        memcpy(ptr, detect->buf + detect->position, more);
        buf_position = more;
        needed -= more;
        detect->position += more;
      }
      if (needed > 0) {
        shortread |= (fread(ptr + buf_position, 1, needed, f) < needed);
      }

      ptr += yuv_frame->stride[plane];
    }
  }

  return shortread;
}